

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  void **ppvVar1;
  int iVar2;
  FileDescriptorProto *descriptor;
  bool bVar3;
  int iVar4;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  FileDescriptor *pFVar5;
  string *element_name;
  string *__rhs;
  long lVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  int local_30;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  _i_1 = proto;
  proto_local = (FileDescriptorProto *)file;
  file_local = (FileDescriptor *)this;
  for (i_2 = 0; iVar2 = i_2,
      iVar4 = FileDescriptor::message_type_count((FileDescriptor *)proto_local), iVar2 < iVar4;
      i_2 = i_2 + 1) {
    lVar7 = *(long *)&(proto_local->weak_dependency_).current_size_;
    lVar6 = (long)i_2;
    proto_00 = FileDescriptorProto::message_type(_i_1,i_2);
    ValidateMessageOptions(this,(Descriptor *)(lVar7 + lVar6 * 0x78),proto_00);
  }
  for (i_3 = 0; iVar2 = i_3, iVar4 = FileDescriptor::enum_type_count((FileDescriptor *)proto_local),
      iVar2 < iVar4; i_3 = i_3 + 1) {
    lVar7 = *(long *)&(proto_local->message_type_).super_RepeatedPtrFieldBase.current_size_;
    lVar6 = (long)i_3;
    proto_01 = FileDescriptorProto::enum_type(_i_1,i_3);
    ValidateEnumOptions(this,(EnumDescriptor *)(lVar7 + lVar6 * 0x38),proto_01);
  }
  for (i_4 = 0; iVar2 = i_4, iVar4 = FileDescriptor::service_count((FileDescriptor *)proto_local),
      iVar2 < iVar4; i_4 = i_4 + 1) {
    ppvVar1 = (proto_local->enum_type_).super_RepeatedPtrFieldBase.elements_;
    lVar7 = (long)i_4;
    proto_02 = FileDescriptorProto::service(_i_1,i_4);
    ValidateServiceOptions(this,(ServiceDescriptor *)(ppvVar1 + lVar7 * 6),proto_02);
  }
  for (local_30 = 0; iVar2 = local_30,
      iVar4 = FileDescriptor::extension_count((FileDescriptor *)proto_local), iVar2 < iVar4;
      local_30 = local_30 + 1) {
    lVar7 = *(long *)&(proto_local->enum_type_).super_RepeatedPtrFieldBase.total_size_;
    lVar6 = (long)local_30;
    proto_03 = FileDescriptorProto::extension(_i_1,local_30);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar7 + lVar6 * 0x78),proto_03);
  }
  bVar3 = IsLite((FileDescriptor *)proto_local);
  if (!bVar3) {
    for (local_34 = 0; iVar2 = local_34,
        iVar4 = FileDescriptor::dependency_count((FileDescriptor *)proto_local), iVar2 < iVar4;
        local_34 = local_34 + 1) {
      pFVar5 = FileDescriptor::dependency((FileDescriptor *)proto_local,local_34);
      bVar3 = IsLite(pFVar5);
      if (bVar3) {
        element_name = FileDescriptor::name_abi_cxx11_((FileDescriptor *)proto_local);
        descriptor = _i_1;
        pFVar5 = FileDescriptor::dependency((FileDescriptor *)proto_local,local_34);
        __rhs = FileDescriptor::name_abi_cxx11_(pFVar5);
        std::operator+(&local_78,
                       "Files that do not use optimize_for = LITE_RUNTIME cannot import files which do use this option.  This file is not lite, but it imports \""
                       ,__rhs);
        std::operator+(&local_58,&local_78,"\" which is.");
        AddError(this,element_name,&descriptor->super_Message,OTHER,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        return;
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
          file->name(), proto,
          DescriptorPool::ErrorCollector::OTHER,
          "Files that do not use optimize_for = LITE_RUNTIME cannot import "
          "files which do use this option.  This file is not lite, but it "
          "imports \"" + file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
}